

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall FIX::Session::generateTestRequest(Session *this,string *id)

{
  pointer pcVar1;
  TestReqID testReqID;
  Message testRequest;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  undefined1 local_1e0 [16];
  _Alloc_hider local_1d0;
  char local_1c0 [16];
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  field_metrics local_190;
  Message local_188;
  
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,&MsgType_TestRequest,0x1d0a91);
  local_1e0._0_8_ = &PTR__FieldBase_001f8470;
  local_1e0._8_4_ = 0x23;
  local_1d0._M_p = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_200,local_1f8 + (long)local_200);
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_190.m_length = 0;
  local_190.m_checksum = 0;
  local_1e0._0_8_ = &PTR__FieldBase_001f9500;
  local_1b0._M_p = (pointer)&local_1a0;
  newMessage(&local_188,this,(MsgType *)local_1e0);
  FieldBase::~FieldBase((FieldBase *)local_1e0);
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  fill(this,&local_188.m_header);
  local_1e0._0_8_ = &PTR__FieldBase_001f8470;
  local_1e0._8_4_ = 0x70;
  pcVar1 = (id->_M_dataplus)._M_p;
  local_1d0._M_p = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + id->_M_string_length);
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_190.m_length = 0;
  local_190.m_checksum = 0;
  local_1e0._0_8_ = &PTR__FieldBase_001fa060;
  local_1b0._M_p = (pointer)&local_1a0;
  FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_1e0,true);
  sendRaw(this,&local_188,0);
  FieldBase::~FieldBase((FieldBase *)local_1e0);
  Message::~Message(&local_188);
  return;
}

Assistant:

void Session::generateTestRequest(const std::string &id) {
  Message testRequest = newMessage(MsgType(MsgType_TestRequest));

  fill(testRequest.getHeader());
  TestReqID testReqID(id);
  testRequest.setField(testReqID);

  sendRaw(testRequest);
}